

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

bool __thiscall jrtplib::RTCPSDESPacket::GotoFirstItem(RTCPSDESPacket *this)

{
  if (((this->super_RTCPPacket).knownformat == true) && (this->currentchunk != (uint8_t *)0x0)) {
    this->itemoffset = 4;
    return this->currentchunk[4] != '\0';
  }
  return false;
}

Assistant:

inline bool RTCPSDESPacket::GotoFirstItem()
{
	if (!knownformat)
		return false;
	if (currentchunk == 0)
		return false;
	itemoffset = sizeof(uint32_t);
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return false;
	return true;
}